

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O1

void __thiscall ASDCP::MXF::SourcePackage::Dump(SourcePackage *this,FILE *stream)

{
  undefined8 uVar1;
  char identbuf [128];
  char local_98 [136];
  
  local_98[0] = '\0';
  if (stream == (FILE *)0x0) {
    stream = (FILE *)_stderr;
  }
  GenericPackage::Dump(&this->super_GenericPackage,stream);
  uVar1 = Kumu::bin2UUIDhex((this->Descriptor).super_Identifier<16U>.m_Value,0x10,local_98,0x80);
  fprintf((FILE *)stream,"  %22s = %s\n","Descriptor",uVar1);
  return;
}

Assistant:

void
SourcePackage::Dump(FILE* stream)
{
  char identbuf[IdentBufferLen];
  *identbuf = 0;

  if ( stream == 0 )
    stream = stderr;

  GenericPackage::Dump(stream);
  fprintf(stream, "  %22s = %s\n",  "Descriptor", Descriptor.EncodeString(identbuf, IdentBufferLen));
}